

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

void Hex::Hexdumper<char>::output_padding(ostream *os,int n,char fillchar)

{
  int iVar1;
  allocator<char> local_41;
  string local_40 [8];
  string padding;
  int oneunit;
  char fillchar_local;
  int n_local;
  ostream *os_local;
  
  padding.field_2._12_4_ = 2;
  if (fillchar != '\0') {
    padding.field_2._12_4_ = 3;
  }
  iVar1 = n * padding.field_2._12_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,(long)iVar1,' ',&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::operator<<(os,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

static void output_padding(std::ostream& os, int n, char fillchar)
    {
        int oneunit = 2*sizeof(T);
        if (fillchar)
            oneunit += 1;
        std::string padding(n*oneunit, ' ');
        os << padding;
    }